

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AddCurrentError(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                  *this,ValidateErrorCode code,bool parent)

{
  ValueType *result;
  ValueType *rhs;
  CrtAllocator *pCVar1;
  ValueType VStack_78;
  PointerType local_68;
  
  result = &this->currentError_;
  AddErrorCode(this,result,code);
  AddErrorInstanceLocation(this,result,parent);
  local_68.tokenCount_ = 0;
  local_68.parseErrorOffset_ = 0;
  local_68.nameBuffer_ = (Ch *)0x0;
  local_68.tokens_ = (Token *)0x0;
  local_68.allocator_ = (CrtAllocator *)0x0;
  local_68.ownAllocator_ = (CrtAllocator *)0x0;
  local_68.parseErrorCode_ = kPointerParseErrorNone;
  AddErrorSchemaLocation(this,result,&local_68);
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::~GenericPointer(&local_68);
  rhs = internal::
        Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
        ::GetValidateErrorKeyword(code);
  if (this->stateAllocator_ == (CrtAllocator *)0x0) {
    pCVar1 = (CrtAllocator *)operator_new(1);
    this->ownStateAllocator_ = pCVar1;
    this->stateAllocator_ = pCVar1;
  }
  GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
  GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)&VStack_78,rhs,
             this->stateAllocator_,false);
  AddError(this,&VStack_78,result);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&VStack_78);
  return;
}

Assistant:

void AddCurrentError(const ValidateErrorCode code, bool parent = false) {
        AddErrorCode(currentError_, code);
        AddErrorInstanceLocation(currentError_, parent);
        AddErrorSchemaLocation(currentError_);
        AddError(ValueType(SchemaType::GetValidateErrorKeyword(code), GetStateAllocator(), false).Move(), currentError_);
    }